

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Select **ppSVar5;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar2 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar2 != 0) {
        return uVar2 & 2;
      }
      iVar3 = sqlite3WalkExprList(pWalker,p->pEList);
      if ((((iVar3 != 0) ||
           ((((p->pWhere != (Expr *)0x0 && (iVar3 = walkExpr(pWalker,p->pWhere), iVar3 != 0)) ||
             (iVar3 = sqlite3WalkExprList(pWalker,p->pGroupBy), iVar3 != 0)) ||
            ((p->pHaving != (Expr *)0x0 && (iVar3 = walkExpr(pWalker,p->pHaving), iVar3 != 0))))))
          || (iVar3 = sqlite3WalkExprList(pWalker,p->pOrderBy), iVar3 != 0)) ||
         (((p->pLimit != (Expr *)0x0 && (iVar3 = walkExpr(pWalker,p->pLimit), iVar3 != 0)) ||
          ((pWalker->pParse != (Parse *)0x0 &&
           ((1 < pWalker->pParse->eParseMode &&
            (iVar3 = walkWindowList(pWalker,p->pWinDefn), iVar3 != 0)))))))) {
        return 2;
      }
      iVar3 = p->pSrc->nSrc;
      if (0 < iVar3) {
        ppSVar5 = &p->pSrc->a[0].pSelect;
        iVar3 = iVar3 + 1;
        do {
          if ((*ppSVar5 != (Select *)0x0) &&
             (iVar4 = sqlite3WalkSelect(pWalker,*ppSVar5), iVar4 != 0)) {
            return 2;
          }
          if (((*(byte *)((long)ppSVar5 + 0x15) & 4) != 0) &&
             (iVar4 = sqlite3WalkExprList(pWalker,((anon_union_8_2_996c0f8d_for_u1 *)(ppSVar5 + 7))
                                                  ->pFuncArg), iVar4 != 0)) {
            return 2;
          }
          ppSVar5 = ppSVar5 + 0xe;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}